

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterNaive.cpp
# Opt level: O1

StepStatus __thiscall
adios2::core::engine::ssc::SscWriterNaive::BeginStep
          (SscWriterNaive *this,StepMode mode,float timeoutSeconds,bool writerLocked)

{
  int64_t *piVar1;
  pointer pBVar2;
  pointer pBVar3;
  uint8_t *puVar4;
  pointer this_00;
  
  piVar1 = &(this->super_SscWriterBase).m_CurrentStep;
  *piVar1 = *piVar1 + 1;
  puVar4 = (uint8_t *)realloc((this->super_SscWriterBase).m_Buffer.m_Buffer,1);
  (this->super_SscWriterBase).m_Buffer.m_Buffer = puVar4;
  (this->super_SscWriterBase).m_Buffer.m_Capacity = 1;
  (this->super_SscWriterBase).m_Buffer.m_Size = 0;
  Buffer::resize(&(this->super_SscWriterBase).m_Buffer,0x10);
  pBVar2 = (this->m_Metadata).
           super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar3 = (this->m_Metadata).
           super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = pBVar2;
  if (pBVar3 != pBVar2) {
    do {
      BlockInfo::~BlockInfo(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pBVar3);
    (this->m_Metadata).
    super__Vector_base<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = pBVar2;
  }
  return OK;
}

Assistant:

StepStatus SscWriterNaive::BeginStep(const StepMode mode, const float timeoutSeconds,
                                     const bool writerLocked)
{
    ++m_CurrentStep;

    m_Buffer.clear();
    m_Buffer.resize(16);
    m_Metadata.clear();

    return StepStatus::OK;
}